

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::destroy_pipeline
          (DeconvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    ppLVar1 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3) <= lVar4) break;
    (*ppLVar1[lVar4]->_vptr_Layer[5])(ppLVar1[lVar4],opt);
    pLVar3 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar4];
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[1])();
    }
    lVar4 = lVar4 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1;
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::destroy_pipeline(const Option& opt)
{
    for (int i = 0; i < (int)group_ops.size(); i++)
    {
        group_ops[i]->destroy_pipeline(opt);
        delete group_ops[i];
    }
    group_ops.clear();

    return 0;
}